

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_overwrite_bool(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_bool(local_180,"key",0xffffffffffffffff,1);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_bool (&b, \"key\", -1, true)";
    uVar3 = 0x1df;
  }
  else {
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
      uVar3 = 0x1e0;
    }
    else {
      iVar2 = bson_iter_type(auStack_200);
      if (iVar2 == 8) {
        bson_iter_overwrite_bool(auStack_200,0);
        cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
        if (cVar1 == '\0') {
          pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
          uVar3 = 0x1e3;
        }
        else {
          iVar2 = bson_iter_type(auStack_200);
          if (iVar2 == 8) {
            cVar1 = bson_iter_bool(auStack_200);
            if (cVar1 == '\0') {
              bson_destroy(local_180);
              return;
            }
            fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_bool (&iter) == false\n",
                    0x1e5);
            abort();
          }
          pcVar4 = "BSON_ITER_HOLDS_BOOL (&iter)";
          uVar3 = 0x1e4;
        }
      }
      else {
        pcVar4 = "BSON_ITER_HOLDS_BOOL (&iter)";
        uVar3 = 0x1e1;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_overwrite_bool",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_overwrite_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_bool (&b, "key", -1, true));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   bson_iter_overwrite_bool (&iter, false);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   BSON_ASSERT_CMPINT (bson_iter_bool (&iter), ==, false);
   bson_destroy (&b);
}